

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QPodArrayOps<QGraphicsItem**>::emplace<QGraphicsItem**&>
          (QPodArrayOps<QGraphicsItem**> *this,qsizetype i,QGraphicsItem ***args)

{
  long lVar1;
  QGraphicsItem **ppQVar2;
  qsizetype qVar3;
  QGraphicsItem ***pppQVar4;
  GrowthPosition where;
  
  if ((*(int **)this != (int *)0x0) && (**(int **)this < 2)) {
    if ((*(long *)(this + 0x10) == i) &&
       (qVar3 = QArrayDataPointer<QGraphicsItem_**>::freeSpaceAtEnd
                          ((QArrayDataPointer<QGraphicsItem_**> *)this), qVar3 != 0)) {
      lVar1 = *(long *)(this + 0x10);
      *(QGraphicsItem ***)(*(long *)(this + 8) + lVar1 * 8) = *args;
      *(long *)(this + 0x10) = lVar1 + 1;
      return;
    }
    if ((i == 0) &&
       (qVar3 = QArrayDataPointer<QGraphicsItem_**>::freeSpaceAtBegin
                          ((QArrayDataPointer<QGraphicsItem_**> *)this), qVar3 != 0)) {
      *(QGraphicsItem ***)(*(long *)(this + 8) + -8) = *args;
      *(long *)(this + 8) = *(long *)(this + 8) + -8;
      *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
      return;
    }
  }
  ppQVar2 = *args;
  where = (GrowthPosition)(i == 0 && *(long *)(this + 0x10) != 0);
  QArrayDataPointer<QGraphicsItem_**>::detachAndGrow
            ((QArrayDataPointer<QGraphicsItem_**> *)this,where,1,(QGraphicsItem ****)0x0,
             (QArrayDataPointer<QGraphicsItem_**> *)0x0);
  pppQVar4 = QPodArrayOps<QGraphicsItem_**>::createHole
                       ((QPodArrayOps<QGraphicsItem_**> *)this,where,i,1);
  *pppQVar4 = ppQVar2;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }